

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O1

int jpc_pi_next(jpc_pi_t *pi)

{
  byte bVar1;
  int iVar2;
  jpc_pirlvl_t *pjVar3;
  uint_fast32_t uVar4;
  uint_fast32_t uVar5;
  ulong uVar6;
  jpc_pirlvl_t *pjVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  jpc_pchg_t *pjVar11;
  ulong uVar12;
  uint *puVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  jpc_picomp_t *pjVar21;
  uint_fast32_t uVar22;
  ulong uVar23;
  uint_fast32_t uVar24;
  ulong uVar25;
  bool bVar26;
  
  do {
    pi->valid = false;
    if (pi->pchg == (jpc_pchg_t *)0x0) {
      iVar2 = pi->pchgno;
      iVar16 = iVar2 + 1;
      pi->pchgno = iVar16;
      pi->compno = 0;
      pi->rlvlno = 0;
      pi->prcno = 0;
      pi->lyrno = 0;
      pi->prgvolfirst = true;
      iVar20 = pi->pchglist->numpchgs;
      if (iVar16 < iVar20) {
        pjVar11 = pi->pchglist->pchgs[(long)iVar2 + 1];
      }
      else {
        pjVar11 = &pi->defaultpchg;
        if (iVar16 != iVar20) {
          return 1;
        }
      }
      pi->pchg = pjVar11;
    }
    pjVar11 = pi->pchg;
    switch(pjVar11->prgord) {
    case '\0':
      if (pi->prgvolfirst == false) {
        puVar13 = pi->pirlvl->prclyrnos + pi->prcno;
        goto LAB_0012e16e;
      }
      pi->prgvolfirst = false;
      pi->lyrno = 0;
      while ((pi->lyrno < pi->numlyrs && ((ulong)pi->lyrno < pjVar11->lyrnoend))) {
        pi->rlvlno = (uint)pjVar11->rlvlnostart;
        while ((pi->rlvlno < pi->maxrlvls && (pi->rlvlno < (uint)pjVar11->rlvlnoend))) {
          uVar23 = pjVar11->compnostart;
          pi->compno = (uint)uVar23;
          pi->picomp = pi->picomps + (uVar23 & 0xffffffff);
          while ((pi->compno < pi->numcomps && ((ulong)pi->compno < pjVar11->compnoend))) {
            uVar10 = pi->rlvlno;
            if (uVar10 < pi->picomp->numrlvls) {
              pjVar3 = pi->picomp->pirlvls;
              pi->pirlvl = pjVar3 + uVar10;
              pi->prcno = 0;
              puVar13 = pjVar3[uVar10].prclyrnos;
              while (pi->prcno < pi->pirlvl->numprcs) {
                uVar15 = pi->lyrno;
                if (*puVar13 <= uVar15) goto LAB_0012e18c;
LAB_0012e16e:
                pi->prcno = pi->prcno + 1;
                puVar13 = puVar13 + 1;
              }
            }
            pi->compno = pi->compno + 1;
            pi->picomp = pi->picomp + 1;
          }
          pi->rlvlno = pi->rlvlno + 1;
        }
        pi->lyrno = pi->lyrno + 1;
      }
      break;
    case '\x01':
      if (pi->prgvolfirst == false) {
        if (pi->prcno < pi->pirlvl->numprcs) {
          puVar13 = pi->pirlvl->prclyrnos + pi->prcno;
          goto LAB_0012e0bc;
        }
        __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                      ,0xbe,"int jpc_pi_nextrlcp(jpc_pi_t *)");
      }
      pi->prgvolfirst = false;
      pi->rlvlno = (uint)pjVar11->rlvlnostart;
      while ((pi->rlvlno < pi->maxrlvls && (pi->rlvlno < (uint)pjVar11->rlvlnoend))) {
        pi->lyrno = 0;
        while ((pi->lyrno < pi->numlyrs && ((ulong)pi->lyrno < pjVar11->lyrnoend))) {
          uVar23 = pjVar11->compnostart;
          pi->compno = (uint)uVar23;
          pi->picomp = pi->picomps + (uVar23 & 0xffffffff);
          while ((pi->compno < pi->numcomps && ((ulong)pi->compno < pjVar11->compnoend))) {
            uVar10 = pi->rlvlno;
            if (uVar10 < pi->picomp->numrlvls) {
              pjVar3 = pi->picomp->pirlvls;
              pi->pirlvl = pjVar3 + uVar10;
              pi->prcno = 0;
              puVar13 = pjVar3[uVar10].prclyrnos;
              while (pi->prcno < pi->pirlvl->numprcs) {
                uVar15 = pi->lyrno;
                if (*puVar13 <= uVar15) goto LAB_0012e18c;
LAB_0012e0bc:
                pi->prcno = pi->prcno + 1;
                puVar13 = puVar13 + 1;
              }
            }
            pi->compno = pi->compno + 1;
            pi->picomp = pi->picomp + 1;
          }
          pi->lyrno = pi->lyrno + 1;
        }
        pi->rlvlno = pi->rlvlno + 1;
      }
      break;
    case '\x02':
      if (pi->prgvolfirst != true) goto LAB_0012e008;
      pi->xstep = 0;
      pi->ystep = 0;
      if (pi->numcomps != 0) {
        pjVar21 = pi->picomps;
        uVar10 = 0;
        do {
          uVar15 = pjVar21->numrlvls;
          if (uVar15 != 0) {
            piVar17 = &pjVar21->pirlvls->prcheightexpn;
            uVar9 = uVar15;
            do {
              uVar9 = uVar9 - 1;
              if ((0x3e < piVar17[-1] + uVar15) || (0x3e < *piVar17 + uVar15))
              goto switchD_0012d5f6_default;
              uVar18 = pjVar21->hsamp << ((char)piVar17[-1] + (char)uVar9 & 0x3fU) & 0xffffffff;
              uVar23 = pi->xstep;
              uVar25 = pi->ystep;
              uVar12 = uVar18;
              if (uVar23 < uVar18) {
                uVar12 = uVar23;
              }
              if (uVar23 == 0) {
                uVar12 = uVar18;
              }
              uVar18 = pjVar21->vsamp << ((char)*piVar17 + (char)uVar9 & 0x3fU) & 0xffffffff;
              uVar23 = uVar18;
              if (uVar25 < uVar18) {
                uVar23 = uVar25;
              }
              if (uVar25 == 0) {
                uVar23 = uVar18;
              }
              pi->xstep = uVar12;
              pi->ystep = uVar23;
              piVar17 = piVar17 + 8;
            } while (uVar9 != 0);
          }
          uVar10 = uVar10 + 1;
          pjVar21 = pjVar21 + 1;
        } while (uVar10 != pi->numcomps);
      }
      pi->prgvolfirst = false;
      pi->rlvlno = (uint)pjVar11->rlvlnostart;
      while ((pi->rlvlno < (uint)pjVar11->rlvlnoend && (pi->rlvlno < pi->maxrlvls))) {
        pi->y = pi->ystart;
        while (pi->y < pi->yend) {
          pi->x = pi->xstart;
          while (pi->x < pi->xend) {
            uVar23 = pjVar11->compnostart;
            pi->compno = (uint)uVar23;
            pi->picomp = pi->picomps + (uVar23 & 0xffffffff);
            while (((ulong)pi->compno < pjVar11->compnoend && (pi->compno < pi->numcomps))) {
              uVar10 = pi->rlvlno;
              pjVar21 = pi->picomp;
              uVar15 = pjVar21->numrlvls;
              if (uVar10 < uVar15) {
                pjVar7 = pjVar21->pirlvls;
                pjVar3 = pjVar7 + uVar10;
                pi->pirlvl = pjVar3;
                uVar9 = pjVar7[uVar10].numprcs;
                if (uVar9 != 0) {
                  bVar8 = (char)uVar15 + ~(byte)uVar10;
                  bVar1 = (byte)pjVar3->prcwidthexpn;
                  bVar14 = (byte)pjVar3->prcheightexpn;
                  uVar23 = pi->x;
                  uVar19 = pjVar21->hsamp << (bVar8 & 0x3f);
                  uVar25 = ((uVar19 + pi->xstart) - 1) / uVar19;
                  uVar18 = pjVar21->vsamp << (bVar8 & 0x3f);
                  uVar12 = ((pi->ystart + uVar18) - 1) / uVar18;
                  if ((((uVar23 == pi->xstart) &&
                       ((uVar25 << (bVar8 & 0x3f) & ~(-1L << (bVar1 + bVar8 & 0x3f))) != 0)) ||
                      ((uVar23 & ~(-1L << (bVar1 + bVar8 & 0x3f))) == 0)) &&
                     (((uVar6 = pi->y, uVar6 == pi->ystart &&
                       ((uVar12 << (bVar8 & 0x3f) & ~(-1L << (bVar14 + bVar8 & 0x3f))) != 0)) ||
                      ((uVar6 & ~(-1L << (bVar14 + bVar8 & 0x3f))) == 0)))) {
                    uVar10 = ((int)((uVar6 + (uVar18 - 1)) / uVar18 >> (bVar14 & 0x3f)) -
                             (int)(uVar12 >> (bVar14 & 0x3f))) * pjVar3->numhprcs +
                             ((int)((uVar23 + (uVar19 - 1)) / uVar19 >> (bVar1 & 0x3f)) -
                             (int)(uVar25 >> (bVar1 & 0x3f)));
                    pi->prcno = uVar10;
                    if (uVar9 <= uVar10) goto switchD_0012d5f6_default;
                    pi->lyrno = 0;
                    while( true ) {
                      uVar10 = pi->lyrno;
                      if ((pi->numlyrs <= uVar10) || (pjVar11->lyrnoend <= (ulong)uVar10)) break;
                      puVar13 = pi->pirlvl->prclyrnos;
                      uVar23 = (ulong)pi->prcno;
                      uVar15 = puVar13[uVar23];
                      if (uVar15 <= uVar10) goto LAB_0012e188;
LAB_0012e008:
                      pi->lyrno = pi->lyrno + 1;
                    }
                  }
                }
              }
              pi->compno = pi->compno + 1;
              pi->picomp = pi->picomp + 1;
            }
            pi->x = (pi->x + pi->xstep) - pi->x % pi->xstep;
          }
          pi->y = (pi->y + pi->ystep) - pi->y % pi->ystep;
        }
        pi->rlvlno = pi->rlvlno + 1;
      }
      break;
    case '\x03':
      if (pi->prgvolfirst != true) goto LAB_0012dd9b;
      pi->xstep = 0;
      pi->ystep = 0;
      if (pi->numcomps != 0) {
        pjVar21 = pi->picomps;
        uVar10 = 0;
        do {
          uVar15 = pjVar21->numrlvls;
          if (uVar15 != 0) {
            piVar17 = &pjVar21->pirlvls->prcheightexpn;
            uVar9 = uVar15;
            do {
              uVar9 = uVar9 - 1;
              if ((0x3e < piVar17[-1] + uVar15) || (0x3e < *piVar17 + uVar15))
              goto switchD_0012d5f6_default;
              uVar18 = pjVar21->hsamp << ((char)piVar17[-1] + (char)uVar9 & 0x3fU) & 0xffffffff;
              uVar23 = pi->xstep;
              uVar25 = pi->ystep;
              uVar12 = uVar18;
              if (uVar23 < uVar18) {
                uVar12 = uVar23;
              }
              if (uVar23 == 0) {
                uVar12 = uVar18;
              }
              uVar18 = pjVar21->vsamp << ((char)*piVar17 + (char)uVar9 & 0x3fU) & 0xffffffff;
              uVar23 = uVar18;
              if (uVar25 < uVar18) {
                uVar23 = uVar25;
              }
              if (uVar25 == 0) {
                uVar23 = uVar18;
              }
              pi->xstep = uVar12;
              pi->ystep = uVar23;
              piVar17 = piVar17 + 8;
            } while (uVar9 != 0);
          }
          uVar10 = uVar10 + 1;
          pjVar21 = pjVar21 + 1;
        } while (uVar10 != pi->numcomps);
      }
      pi->prgvolfirst = false;
      pi->y = pi->ystart;
      while (pi->y < pi->yend) {
        pi->x = pi->xstart;
        while (pi->x < pi->xend) {
          uVar23 = pjVar11->compnostart;
          pi->compno = (uint)uVar23;
          pi->picomp = pi->picomps + (uVar23 & 0xffffffff);
          while ((pi->compno < pi->numcomps && ((ulong)pi->compno < pjVar11->compnoend))) {
            bVar1 = pjVar11->rlvlnostart;
            pi->rlvlno = (uint)bVar1;
            pi->pirlvl = pi->picomp->pirlvls + bVar1;
            while( true ) {
              uVar10 = pi->rlvlno;
              pjVar21 = pi->picomp;
              if ((pjVar21->numrlvls <= uVar10) || (pjVar11->rlvlnoend <= uVar10)) break;
              pjVar3 = pi->pirlvl;
              uVar15 = pjVar3->numprcs;
              if (uVar15 != 0) {
                bVar14 = (char)pjVar21->numrlvls + ~(byte)uVar10;
                uVar23 = pi->x;
                uVar19 = pjVar21->hsamp << (bVar14 & 0x3f);
                uVar18 = pjVar21->vsamp << (bVar14 & 0x3f);
                uVar25 = ((pi->xstart + uVar19) - 1) / uVar19;
                uVar12 = ((uVar18 + pi->ystart) - 1) / uVar18;
                bVar1 = (byte)pjVar3->prcwidthexpn;
                bVar8 = (byte)pjVar3->prcheightexpn;
                if ((((uVar23 == pi->xstart) &&
                     ((uVar25 << (bVar14 & 0x3f) & ~(-1L << (bVar1 + bVar14 & 0x3f))) != 0)) ||
                    (uVar23 % (pjVar21->hsamp << (bVar1 + bVar14 & 0x3f)) == 0)) &&
                   (((uVar6 = pi->y, uVar6 == pi->ystart &&
                     ((uVar12 << (bVar14 & 0x3f) & ~(-1L << (bVar8 + bVar14 & 0x3f))) != 0)) ||
                    (uVar6 % (pjVar21->vsamp << (bVar8 + bVar14 & 0x3f)) == 0)))) {
                  uVar10 = ((int)((uVar6 + (uVar18 - 1)) / uVar18 >> (bVar8 & 0x3f)) -
                           (int)(uVar12 >> (bVar8 & 0x3f))) * pjVar3->numhprcs +
                           ((int)((uVar23 + (uVar19 - 1)) / uVar19 >> (bVar1 & 0x3f)) -
                           (int)(uVar25 >> (bVar1 & 0x3f)));
                  pi->prcno = uVar10;
                  if (uVar15 <= uVar10) {
                    __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                                  ,0x198,"int jpc_pi_nextpcrl(jpc_pi_t *)");
                  }
                  pi->lyrno = 0;
                  while( true ) {
                    uVar10 = pi->lyrno;
                    if ((pi->numlyrs <= uVar10) || (pjVar11->lyrnoend <= (ulong)uVar10)) break;
                    puVar13 = pi->pirlvl->prclyrnos;
                    uVar23 = (ulong)pi->prcno;
                    uVar15 = puVar13[uVar23];
                    if (uVar15 <= uVar10) goto LAB_0012e188;
LAB_0012dd9b:
                    pi->lyrno = pi->lyrno + 1;
                  }
                }
              }
              pi->rlvlno = pi->rlvlno + 1;
              pi->pirlvl = pi->pirlvl + 1;
            }
            pi->compno = pi->compno + 1;
            pi->picomp = pjVar21 + 1;
          }
          pi->x = (pi->x + pi->xstep) - pi->x % pi->xstep;
        }
        pi->y = (pi->y + pi->ystep) - pi->y % pi->ystep;
      }
      break;
    case '\x04':
      if (pi->prgvolfirst != true) goto LAB_0012db2c;
      pi->prgvolfirst = false;
      uVar23 = pjVar11->compnostart;
      pi->compno = (uint)uVar23;
      pi->picomp = pi->picomps + (uVar23 & 0xffffffff);
      while (((ulong)pi->compno < pjVar11->compnoend && (pi->compno < pi->numcomps))) {
        pjVar21 = pi->picomp;
        pjVar3 = pjVar21->pirlvls;
        uVar10 = pjVar21->numrlvls;
        uVar15 = pjVar3->prcwidthexpn + uVar10;
        if ((0x3e < uVar15) || (uVar9 = pjVar3->prcheightexpn + uVar10, 0x3e < uVar9)) break;
        uVar4 = pjVar21->hsamp;
        uVar22 = uVar4 << ((char)uVar15 - 1U & 0x3f);
        pi->xstep = uVar22;
        uVar5 = pjVar21->vsamp;
        uVar24 = uVar5 << ((char)uVar9 - 1U & 0x3f);
        pi->ystep = uVar24;
        if (1 < uVar10) {
          iVar20 = uVar10 - 2;
          piVar17 = &pjVar3[1].prcheightexpn;
          do {
            uVar23 = uVar4 << ((char)piVar17[-1] + (char)iVar20 & 0x3fU);
            if (uVar22 < uVar23) {
              uVar23 = uVar22;
            }
            uVar25 = uVar5 << ((char)*piVar17 + (char)iVar20 & 0x3fU);
            if (uVar24 < uVar25) {
              uVar25 = uVar24;
            }
            piVar17 = piVar17 + 8;
            bVar26 = iVar20 != 0;
            iVar20 = iVar20 + -1;
            uVar22 = uVar23;
            uVar24 = uVar25;
          } while (bVar26);
          pi->xstep = uVar23;
          pi->ystep = uVar25;
        }
        pi->y = pi->ystart;
        while (pi->y < pi->yend) {
          pi->x = pi->xstart;
          while (pi->x < pi->xend) {
            bVar1 = pjVar11->rlvlnostart;
            pi->rlvlno = (uint)bVar1;
            pi->pirlvl = pi->picomp->pirlvls + bVar1;
            while( true ) {
              uVar10 = pi->rlvlno;
              pjVar21 = pi->picomp;
              if ((pjVar21->numrlvls <= uVar10) || (pjVar11->rlvlnoend <= uVar10)) break;
              pjVar3 = pi->pirlvl;
              uVar15 = pjVar3->numprcs;
              if (uVar15 != 0) {
                bVar14 = (char)pjVar21->numrlvls + ~(byte)uVar10;
                uVar23 = pi->x;
                uVar19 = pjVar21->hsamp << (bVar14 & 0x3f);
                uVar18 = pjVar21->vsamp << (bVar14 & 0x3f);
                uVar25 = ((pi->xstart + uVar19) - 1) / uVar19;
                uVar12 = ((uVar18 + pi->ystart) - 1) / uVar18;
                bVar1 = (byte)pjVar3->prcwidthexpn;
                bVar8 = (byte)pjVar3->prcheightexpn;
                if ((((uVar23 == pi->xstart) &&
                     ((uVar25 << (bVar14 & 0x3f) & ~(-1L << (bVar1 + bVar14 & 0x3f))) != 0)) ||
                    (uVar23 % (pjVar21->hsamp << (bVar1 + bVar14 & 0x3f)) == 0)) &&
                   (((uVar6 = pi->y, uVar6 == pi->ystart &&
                     ((uVar12 << (bVar14 & 0x3f) & ~(-1L << (bVar8 + bVar14 & 0x3f))) != 0)) ||
                    (uVar6 % (pjVar21->vsamp << (bVar8 + bVar14 & 0x3f)) == 0)))) {
                  uVar10 = ((int)((uVar6 + (uVar18 - 1)) / uVar18 >> (bVar8 & 0x3f)) -
                           (int)(uVar12 >> (bVar8 & 0x3f))) * pjVar3->numhprcs +
                           ((int)((uVar23 + (uVar19 - 1)) / uVar19 >> (bVar1 & 0x3f)) -
                           (int)(uVar25 >> (bVar1 & 0x3f)));
                  pi->prcno = uVar10;
                  if (uVar15 <= uVar10) {
                    __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                                  ,0x1f6,"int jpc_pi_nextcprl(jpc_pi_t *)");
                  }
                  pi->lyrno = 0;
                  while( true ) {
                    uVar10 = pi->lyrno;
                    if ((pi->numlyrs <= uVar10) || (pjVar11->lyrnoend <= (ulong)uVar10)) break;
                    puVar13 = pi->pirlvl->prclyrnos;
                    uVar23 = (ulong)pi->prcno;
                    uVar15 = puVar13[uVar23];
                    if (uVar15 <= uVar10) goto LAB_0012e188;
LAB_0012db2c:
                    pi->lyrno = pi->lyrno + 1;
                  }
                }
              }
              pi->rlvlno = pi->rlvlno + 1;
              pi->pirlvl = pi->pirlvl + 1;
            }
            pi->x = (pi->x + pi->xstep) - pi->x % pi->xstep;
          }
          pi->y = (pi->y + pi->ystep) - pi->y % pi->ystep;
        }
        pi->compno = pi->compno + 1;
        pi->picomp = pi->picomp + 1;
      }
    }
switchD_0012d5f6_default:
    pi->pchg = (jpc_pchg_t *)0x0;
  } while( true );
LAB_0012e188:
  puVar13 = puVar13 + uVar23;
LAB_0012e18c:
  *puVar13 = uVar15 + 1;
  pi->valid = true;
  pi->pktno = pi->pktno + 1;
  return 0;
}

Assistant:

int jpc_pi_next(jpc_pi_t *pi)
{
	jpc_pchg_t *pchg;
	int ret;

	for (;;) {

		pi->valid = false;

		if (!pi->pchg) {
			++pi->pchgno;
			pi->compno = 0;
			pi->rlvlno = 0;
			pi->prcno = 0;
			pi->lyrno = 0;
			pi->prgvolfirst = true;
			if (pi->pchgno < jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = jpc_pchglist_get(pi->pchglist, pi->pchgno);
			} else if (pi->pchgno == jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = &pi->defaultpchg;
			} else {
				return 1;
			}
		}

		pchg = pi->pchg;
		switch (pchg->prgord) {
		case JPC_COD_LRCPPRG:
			ret = jpc_pi_nextlrcp(pi);
			break;
		case JPC_COD_RLCPPRG:
			ret = jpc_pi_nextrlcp(pi);
			break;
		case JPC_COD_RPCLPRG:
			ret = jpc_pi_nextrpcl(pi);
			break;
		case JPC_COD_PCRLPRG:
			ret = jpc_pi_nextpcrl(pi);
			break;
		case JPC_COD_CPRLPRG:
			ret = jpc_pi_nextcprl(pi);
			break;
		default:
			ret = -1;
			break;
		}
		if (!ret) {
			pi->valid = true;
			++pi->pktno;
			return 0;
		}
		pi->pchg = 0;
	}
}